

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format_lite.h
# Opt level: O0

size_t google::protobuf::internal::WireFormatLite::TagSize(int field_number,FieldType type)

{
  int in_ESI;
  size_t result;
  size_t local_8;
  
  local_8 = io::CodedOutputStream::VarintSize32(0);
  if (in_ESI == 10) {
    local_8 = local_8 << 1;
  }
  return local_8;
}

Assistant:

inline size_t WireFormatLite::TagSize(int field_number,
                                      WireFormatLite::FieldType type) {
  size_t result = io::CodedOutputStream::VarintSize32(
      static_cast<uint32>(field_number << kTagTypeBits));
  if (type == TYPE_GROUP) {
    // Groups have both a start and an end tag.
    return result * 2;
  } else {
    return result;
  }
}